

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracer.cpp
# Opt level: O1

void __thiscall RayTracer::processPixels(RayTracer *this)

{
  pointer *this_00;
  int threadId;
  long lVar1;
  code *local_70;
  undefined8 local_68;
  RayTracer *local_60;
  undefined1 auStack_58 [8];
  vector<std::thread,_std::allocator<std::thread>_> thVec;
  int local_34;
  
  auStack_58 = (undefined1  [8])0x0;
  thVec.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  thVec.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_34 = 0;
  if (this->threadNumber < 2) {
    threadId = this->threadNumber + -1;
  }
  else {
    this_00 = &thVec.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    do {
      local_70 = processPixelsThreads;
      local_68 = 0;
      local_60 = this;
      std::thread::thread<void(RayTracer::*)(int),RayTracer*,int&,void>
                ((thread *)this_00,(offset_in_RayTracer_to_subr *)&local_70,&local_60,&local_34);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                ((vector<std::thread,_std::allocator<std::thread>_> *)auStack_58,(thread *)this_00);
      if (thVec.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        std::terminate();
      }
      local_34 = local_34 + 1;
      threadId = this->threadNumber + -1;
    } while (local_34 < threadId);
  }
  processPixelsThreads(this,threadId);
  if (1 < this->threadNumber) {
    lVar1 = 0;
    do {
      std::thread::join();
      lVar1 = lVar1 + 1;
    } while (lVar1 < (long)this->threadNumber + -1);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)auStack_58);
  return;
}

Assistant:

void RayTracer::processPixels()
{
  std::vector<std::thread> thVec;
  for (int i = 0; i < threadNumber - 1; i++)
    thVec.push_back(std::thread(&RayTracer::processPixelsThreads, this, i));

  processPixelsThreads(threadNumber - 1);

  for (int i = 0; i < threadNumber - 1; i++)
    thVec[i].join();
}